

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergePartial
               (CodedInputStream *input,Message *message)

{
  bool bVar1;
  int iVar2;
  WireType WVar3;
  int key;
  Descriptor *this;
  undefined4 extraout_var;
  DescriptorPool *pDVar4;
  MessageOptions *this_00;
  FieldDescriptor *pFStack_60;
  int field_number;
  FieldDescriptor *field;
  uint32 tag;
  Reflection *message_reflection;
  Descriptor *descriptor;
  Message *message_local;
  CodedInputStream *input_local;
  uint32 local_1c;
  uint32 v;
  uint32 local_c;
  
  this = Message::GetDescriptor(message);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  do {
    while( true ) {
      local_1c = 0;
      if ((input->buffer_ < input->buffer_end_) &&
         (local_1c = (uint32)*input->buffer_, local_1c < 0x80)) {
        input->last_tag_ = local_1c;
        io::CodedInputStream::Advance(input,1);
        local_c = local_1c;
      }
      else {
        local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
        input->last_tag_ = local_c;
      }
      if (local_c == 0) {
        return true;
      }
      WVar3 = WireFormatLite::GetTagWireType(local_c);
      if (WVar3 == WIRETYPE_END_GROUP) {
        return true;
      }
      pFStack_60 = (FieldDescriptor *)0x0;
      if (this != (Descriptor *)0x0) break;
LAB_005ae7a9:
      bVar1 = ParseAndMergeField(local_c,pFStack_60,message,input);
      if (!bVar1) {
        return false;
      }
    }
    key = WireFormatLite::GetTagFieldNumber(local_c);
    pFStack_60 = Descriptor::FindFieldByNumber(this,key);
    if ((pFStack_60 == (FieldDescriptor *)0x0) &&
       (bVar1 = Descriptor::IsExtensionNumber(this,key), bVar1)) {
      pDVar4 = io::CodedInputStream::GetExtensionPool(input);
      if (pDVar4 == (DescriptorPool *)0x0) {
        pFStack_60 = (FieldDescriptor *)
                     (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x270))
                               ((long *)CONCAT44(extraout_var,iVar2),key);
      }
      else {
        pDVar4 = io::CodedInputStream::GetExtensionPool(input);
        pFStack_60 = DescriptorPool::FindExtensionByNumber(pDVar4,this,key);
      }
    }
    if (pFStack_60 != (FieldDescriptor *)0x0) goto LAB_005ae7a9;
    this_00 = Descriptor::options(this);
    bVar1 = MessageOptions::message_set_wire_format(this_00);
    if ((!bVar1) || (local_c != 0xb)) goto LAB_005ae7a9;
    bVar1 = ParseAndMergeMessageSetItem(input,message);
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergePartial(io::CodedInputStream* input,
                                      Message* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  const Reflection* message_reflection = message->GetReflection();

  while(true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    if (WireFormatLite::GetTagWireType(tag) ==
        WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    const FieldDescriptor* field = NULL;

    if (descriptor != NULL) {
      int field_number = WireFormatLite::GetTagFieldNumber(tag);
      field = descriptor->FindFieldByNumber(field_number);

      // If that failed, check if the field is an extension.
      if (field == NULL && descriptor->IsExtensionNumber(field_number)) {
        if (input->GetExtensionPool() == NULL) {
          field = message_reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = input->GetExtensionPool()
                       ->FindExtensionByNumber(descriptor, field_number);
        }
      }

      // If that failed, but we're a MessageSet, and this is the tag for a
      // MessageSet item, then parse that.
      if (field == NULL &&
          descriptor->options().message_set_wire_format() &&
          tag == WireFormatLite::kMessageSetItemStartTag) {
        if (!ParseAndMergeMessageSetItem(input, message)) {
          return false;
        }
        continue;  // Skip ParseAndMergeField(); already taken care of.
      }
    }

    if (!ParseAndMergeField(tag, field, message, input)) {
      return false;
    }
  }
}